

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnode.c
# Opt level: O0

int lnode_call_file(lua_State *L,char *filename)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  int local_24;
  int ret;
  char *filename_local;
  lua_State *L_local;
  
  iVar2 = luaL_loadfilex(L,filename,(char *)0x0);
  pFVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = lua_pcallk(L,0,1,0,0,(lua_KFunction)0x0);
    pFVar1 = _stderr;
    if (iVar2 == 0) {
      local_24 = 0;
      iVar2 = lua_type(L,-1);
      if (iVar2 == 3) {
        lVar4 = lua_tointegerx(L,-1,(int *)0x0);
        local_24 = (int)lVar4;
      }
      L_local._4_4_ = local_24;
    }
    else {
      pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
      fprintf(pFVar1,"%s\n",pcVar3);
      L_local._4_4_ = -1;
    }
  }
  else {
    pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
    fprintf(pFVar1,"%s\n",pcVar3);
    L_local._4_4_ = -1;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int lnode_call_file(lua_State* L, const char* filename) {
  // Load the *.lua script

  if (luaL_loadfilex(L, filename, NULL)) {
    fprintf(stderr, "%s\n", lua_tostring(L, -1));
    return -1;
  }

  // Start the main script.
  if (lua_pcall(L, 0, 1, 0)) {
    fprintf(stderr, "%s\n", lua_tostring(L, -1));
    return -1;
  }

  // Use the return value from the script as process exit code.
  int ret = 0;
  if (lua_type(L, -1) == LUA_TNUMBER) {
    ret = lua_tointeger(L, -1);
  }

  return ret;
}